

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestMemoryAllocator.cpp
# Opt level: O0

MemoryAccountantAllocationNode * __thiscall
MemoryAccountant::findOrCreateNodeOfSize(MemoryAccountant *this,size_t size)

{
  MemoryAccountantAllocationNode *pMVar1;
  MemoryAccountantAllocationNode *pMVar2;
  ulong in_RSI;
  MemoryAccountant *in_RDI;
  MemoryAccountantAllocationNode *node;
  MemoryAccountantAllocationNode *in_stack_ffffffffffffffe0;
  MemoryAccountant *this_00;
  MemoryAccountantAllocationNode *local_8;
  
  if ((in_RDI->useCacheSizes_ & 1U) == 0) {
    this_00 = in_RDI;
    if ((in_RDI->head_ != (MemoryAccountantAllocationNode *)0x0) && (in_RSI < in_RDI->head_->size_))
    {
      pMVar1 = createNewAccountantAllocationNode(in_RDI,in_RSI,in_stack_ffffffffffffffe0);
      in_RDI->head_ = pMVar1;
    }
    for (pMVar1 = in_RDI->head_; pMVar1 != (MemoryAccountantAllocationNode *)0x0;
        pMVar1 = pMVar1->next_) {
      if (pMVar1->size_ == in_RSI) {
        return pMVar1;
      }
      if ((pMVar1->next_ == (MemoryAccountantAllocationNode *)0x0) ||
         (in_RSI < pMVar1->next_->size_)) {
        pMVar2 = createNewAccountantAllocationNode(this_00,in_RSI,pMVar1);
        pMVar1->next_ = pMVar2;
      }
    }
    pMVar1 = createNewAccountantAllocationNode(this_00,in_RSI,(MemoryAccountantAllocationNode *)0x0)
    ;
    in_RDI->head_ = pMVar1;
    local_8 = in_RDI->head_;
  }
  else {
    local_8 = findNodeOfSize(in_RDI,in_RSI);
  }
  return local_8;
}

Assistant:

MemoryAccountantAllocationNode* MemoryAccountant::findOrCreateNodeOfSize(size_t size)
{
    if (useCacheSizes_)
      return findNodeOfSize(size);

    if (head_ && head_->size_ > size)
        head_ = createNewAccountantAllocationNode(size, head_);

    for (MemoryAccountantAllocationNode* node = head_; node; node = node->next_) {
        if (node->size_ == size)
            return node;
        if (node->next_ == NULLPTR || node->next_->size_ > size)
            node->next_ = createNewAccountantAllocationNode(size, node->next_);
    }
    head_ = createNewAccountantAllocationNode(size, head_);
    return head_;
}